

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_Error tt_face_build_cmaps(TT_Face face)

{
  FT_Byte *pFVar1;
  uint uVar2;
  int iVar3;
  FT_Error FVar4;
  FT_Byte *limit_00;
  FT_Byte *base;
  FT_CMap_conflict local_170;
  FT_CMap ttcmap;
  undefined1 local_160 [4];
  FT_Error error;
  TT_ValidatorRec valid;
  TT_CMap_Class clazz;
  TT_CMap_Class *pclazz;
  FT_UInt format;
  FT_Byte *cmap;
  undefined1 auStack_50 [4];
  FT_UInt32 offset;
  FT_CharMapRec charmap;
  FT_Library library;
  FT_Byte *p;
  FT_UInt num_cmaps;
  FT_Byte *limit;
  FT_Byte *table;
  TT_Face face_local;
  
  pFVar1 = face->cmap_table;
  limit_00 = pFVar1 + face->cmap_size;
  charmap._8_8_ = (((face->root).driver)->root).library;
  if ((pFVar1 == (FT_Byte *)0x0) || (limit_00 < pFVar1 + 4)) {
    face_local._4_4_ = 8;
  }
  else if (CONCAT11(*pFVar1,pFVar1[1]) == 0) {
    library = (FT_Library)(pFVar1 + 4);
    for (p._4_4_ = (uint)CONCAT11(pFVar1[2],pFVar1[3]);
        p._4_4_ != 0 && &library->version_major <= limit_00; p._4_4_ = p._4_4_ - 1) {
      charmap.face._4_2_ =
           CONCAT11(*(undefined1 *)&library->memory,*(undefined1 *)((long)&library->memory + 1));
      charmap.face._6_2_ =
           CONCAT11(*(undefined1 *)((long)&library->memory + 2),
                    *(undefined1 *)((long)&library->memory + 3));
      charmap.face._0_4_ = 0;
      uVar2 = (uint)*(byte *)((long)&library->memory + 4) << 0x18 |
              (uint)*(byte *)((long)&library->memory + 5) << 0x10 |
              (uint)*(byte *)((long)&library->memory + 6) << 8 |
              (uint)*(byte *)((long)&library->memory + 7);
      if ((uVar2 != 0) && ((ulong)uVar2 <= face->cmap_size - 2)) {
        base = pFVar1 + uVar2;
        for (clazz = (TT_CMap_Class)tt_cmap_classes; (clazz->clazz).size != 0;
            clazz = (TT_CMap_Class)&(clazz->clazz).init) {
          valid._224_8_ = (clazz->clazz).size;
          if (*(uint *)(valid._224_8_ + 0x50) == (uint)CONCAT11(*base,base[1])) {
            ttcmap._4_4_ = FT_ENCODING_NONE;
            _auStack_50 = face;
            ft_validator_init((FT_Validator)local_160,base,limit_00,FT_VALIDATE_DEFAULT);
            valid.validator.level = (FT_ValidationLevel)(face->max_profile).numGlyphs;
            iVar3 = _setjmp((__jmp_buf_tag *)local_160);
            if (iVar3 == 0) {
              ttcmap._4_4_ = (**(code **)(valid._224_8_ + 0x58))(base,local_160);
            }
            if ((valid.validator.limit._4_4_ == 0) &&
               (FVar4 = FT_CMap_New((FT_CMap_Class)valid._224_8_,base,(FT_CharMap)auStack_50,
                                    &local_170), FVar4 == 0)) {
              local_170[1].charmap.encoding = ttcmap._4_4_;
            }
            break;
          }
        }
      }
      library = (FT_Library)&library->version_major;
    }
    face_local._4_4_ = 0;
  }
  else {
    face_local._4_4_ = 8;
  }
  return face_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_build_cmaps( TT_Face  face )
  {
    FT_Byte*           table = face->cmap_table;
    FT_Byte*           limit = table + face->cmap_size;
    FT_UInt volatile   num_cmaps;
    FT_Byte* volatile  p     = table;
    FT_Library         library = FT_FACE_LIBRARY( face );

    FT_UNUSED( library );


    if ( !p || p + 4 > limit )
      return FT_THROW( Invalid_Table );

    /* only recognize format 0 */
    if ( TT_NEXT_USHORT( p ) != 0 )
    {
      FT_ERROR(( "tt_face_build_cmaps:"
                 " unsupported `cmap' table format = %d\n",
                 TT_PEEK_USHORT( p - 2 ) ));
      return FT_THROW( Invalid_Table );
    }

    num_cmaps = TT_NEXT_USHORT( p );

    for ( ; num_cmaps > 0 && p + 8 <= limit; num_cmaps-- )
    {
      FT_CharMapRec  charmap;
      FT_UInt32      offset;


      charmap.platform_id = TT_NEXT_USHORT( p );
      charmap.encoding_id = TT_NEXT_USHORT( p );
      charmap.face        = FT_FACE( face );
      charmap.encoding    = FT_ENCODING_NONE;  /* will be filled later */
      offset              = TT_NEXT_ULONG( p );

      if ( offset && offset <= face->cmap_size - 2 )
      {
        FT_Byte* volatile              cmap   = table + offset;
        volatile FT_UInt               format = TT_PEEK_USHORT( cmap );
        const TT_CMap_Class* volatile  pclazz = TT_CMAP_CLASSES_GET;
        TT_CMap_Class volatile         clazz;


        for ( ; *pclazz; pclazz++ )
        {
          clazz = *pclazz;
          if ( clazz->format == format )
          {
            volatile TT_ValidatorRec  valid;
            volatile FT_Error         error = FT_Err_Ok;


            ft_validator_init( FT_VALIDATOR( &valid ), cmap, limit,
                               FT_VALIDATE_DEFAULT );

            valid.num_glyphs = (FT_UInt)face->max_profile.numGlyphs;

            if ( ft_setjmp( FT_VALIDATOR( &valid )->jump_buffer) == 0 )
            {
              /* validate this cmap sub-table */
              error = clazz->validate( cmap, FT_VALIDATOR( &valid ) );
            }

            if ( !valid.validator.error )
            {
              FT_CMap  ttcmap;


              /* It might make sense to store the single variation         */
              /* selector cmap somewhere special.  But it would have to be */
              /* in the public FT_FaceRec, and we can't change that.       */

              if ( !FT_CMap_New( (FT_CMap_Class)clazz,
                                 cmap, &charmap, &ttcmap ) )
              {
                /* it is simpler to directly set `flags' than adding */
                /* a parameter to FT_CMap_New                        */
                ((TT_CMap)ttcmap)->flags = (FT_Int)error;
              }
            }
            else
            {
              FT_TRACE0(( "tt_face_build_cmaps:"
                          " broken cmap sub-table ignored\n" ));
            }
            break;
          }
        }

        if ( !*pclazz )
        {
          FT_TRACE0(( "tt_face_build_cmaps:"
                      " unsupported cmap sub-table ignored\n" ));
        }
      }
    }

    return FT_Err_Ok;
  }